

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.c
# Opt level: O0

void button_state_reset(natwm_state *state)

{
  natwm_state *state_local;
  
  natwm_state_lock(state);
  state->button_state->grabbed_client = (client *)0x0;
  state->button_state->monitor_rect = (xcb_rectangle_t *)0x0;
  state->button_state->start_x = 0;
  state->button_state->start_y = 0;
  natwm_state_unlock(state);
  return;
}

Assistant:

static void button_state_reset(struct natwm_state *state)
{
        natwm_state_lock(state);

        state->button_state->grabbed_client = NULL;
        state->button_state->monitor_rect = NULL;
        state->button_state->start_x = 0;
        state->button_state->start_y = 0;

        natwm_state_unlock(state);
}